

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  CoveringIndexCheck *pCVar1;
  Index *pIVar2;
  int iVar3;
  CoveringIndexCheck *pCk;
  u16 nColumn;
  i16 *aiColumn;
  Index *pIdx;
  int i;
  Expr *pExpr_local;
  Walker *pWalk_local;
  
  pCVar1 = (pWalk->u).pCovIdxCk;
  if ((pExpr->op == 0xa7) || (pExpr->op == 0xa9)) {
    if (pExpr->iTable == pCVar1->iTabCur) {
      pIVar2 = ((pWalk->u).pIdxCover)->pIdx;
      for (pIdx._4_4_ = 0; pIdx._4_4_ < (int)(uint)pIVar2->nColumn; pIdx._4_4_ = pIdx._4_4_ + 1) {
        if (pIVar2->aiColumn[pIdx._4_4_] == pExpr->iColumn) {
          return 0;
        }
      }
      pCVar1->bUnidx = '\x01';
      pWalk_local._4_4_ = 2;
    }
    else {
      pWalk_local._4_4_ = 0;
    }
  }
  else {
    if (((*(ushort *)&pCVar1->pIdx->field_0x63 >> 0xb & 1) != 0) &&
       (iVar3 = exprIsCoveredByIndex(pExpr,pCVar1->pIdx,((pWalk->u).pIdxCover)->iCur), iVar3 != 0))
    {
      pCVar1->bExpr = '\x01';
      return 1;
    }
    pWalk_local._4_4_ = 0;
  }
  return pWalk_local._4_4_;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                    /* Loop counter */
  const Index *pIdx;        /* The index of interest */
  const i16 *aiColumn;      /* Columns contained in the index */
  u16 nColumn;              /* Number of columns in the index */
  CoveringIndexCheck *pCk;  /* Info about this search */

  pCk = pWalk->u.pCovIdxCk;
  pIdx = pCk->pIdx;
  if( (pExpr->op==TK_COLUMN || pExpr->op==TK_AGG_COLUMN) ){
    /* if( pExpr->iColumn<(BMS-1) && pIdx->bHasExpr==0 ) return WRC_Continue;*/
    if( pExpr->iTable!=pCk->iTabCur ) return WRC_Continue;
    pIdx = pWalk->u.pCovIdxCk->pIdx;
    aiColumn = pIdx->aiColumn;
    nColumn = pIdx->nColumn;
    for(i=0; i<nColumn; i++){
      if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
    }
    pCk->bUnidx = 1;
    return WRC_Abort;
  }else if( pIdx->bHasExpr
         && exprIsCoveredByIndex(pExpr, pIdx, pWalk->u.pCovIdxCk->iTabCur) ){
    pCk->bExpr = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}